

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

char * Cba_FonNameStr(Cba_Ntk_t *p,int f)

{
  int i;
  char *pcVar1;
  
  if ((p->vFonName).nSize < 1) {
    pcVar1 = "Cba_NtkHasFonNames(p)";
  }
  else {
    if (0 < f) {
      i = Cba_FonName(p,f);
      pcVar1 = Cba_NtkStr(p,i);
      return pcVar1;
    }
    pcVar1 = "Cba_FonIsReal(f)";
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
}

Assistant:

static inline char *         Cba_FonNameStr( Cba_Ntk_t * p, int f )          { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); return Cba_NtkStr(p, Cba_FonName(p, f));                          }